

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# relax_snode.c
# Opt level: O0

void relax_snode(int n,int *et,int relax_columns,int *descendants,int *relax_end)

{
  int iVar1;
  bool bVar2;
  int local_38;
  int snode_start;
  int parent;
  int j;
  int *relax_end_local;
  int *descendants_local;
  int relax_columns_local;
  int *et_local;
  int n_local;
  
  ifill(relax_end,n,-1);
  for (snode_start = 0; snode_start < n; snode_start = snode_start + 1) {
    descendants[snode_start] = 0;
  }
  for (snode_start = 0; snode_start < n; snode_start = snode_start + 1) {
    iVar1 = et[snode_start];
    if (iVar1 != n) {
      descendants[iVar1] = descendants[snode_start] + 1 + descendants[iVar1];
    }
  }
  snode_start = 0;
  while (iVar1 = snode_start, snode_start < n) {
    local_38 = et[snode_start];
    while( true ) {
      bVar2 = false;
      if (local_38 != n) {
        bVar2 = descendants[local_38] < relax_columns;
      }
      if (!bVar2) break;
      snode_start = local_38;
      local_38 = et[local_38];
    }
    relax_end[iVar1] = snode_start;
    do {
      snode_start = snode_start + 1;
    } while (descendants[snode_start] != 0 && snode_start < n);
  }
  return;
}

Assistant:

void
relax_snode (
	     const     int n,
                  const int *et,           /* column elimination tree */
	     const int relax_columns, /* max no of columns allowed in a
					 relaxed snode */
	     int       *descendants,  /* no of descendants of each node
					 in the etree */
	     int       *relax_end     /* last column in a supernode */
	     )
{

    register int j, parent;
    register int snode_start;	/* beginning of a snode */
    
    ifill (relax_end, n, SLU_EMPTY);
    for (j = 0; j < n; j++) descendants[j] = 0;

    /* Compute the number of descendants of each node in the etree */
    for (j = 0; j < n; j++) {
	parent = et[j];
	if ( parent != n )  /* not the dummy root */
	    descendants[parent] += descendants[j] + 1;
    }

    /* Identify the relaxed supernodes by postorder traversal of the etree. */
    for (j = 0; j < n; ) { 
     	parent = et[j];
        snode_start = j;
 	while ( parent != n && descendants[parent] < relax_columns ) {
	    j = parent;
	    parent = et[j];
	}
	/* Found a supernode with j being the last column. */
	relax_end[snode_start] = j;		/* Last column is recorded */
	j++;
	/* Search for a new leaf */
	while ( descendants[j] != 0 && j < n ) j++;
    }

    /*printf("No of relaxed snodes: %d; relaxed columns: %d\n", 
		nsuper, no_relaxed_col); */
}